

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O0

void advance_engine<trng::mt19937>(mt19937 *r1,mt19937 *r2,long N)

{
  long in_RDX;
  mt19937 *in_RSI;
  mt19937 *in_RDI;
  long i;
  undefined8 local_20;
  
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    trng::mt19937::operator()(in_RDI);
    trng::mt19937::operator()(in_RSI);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}